

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O0

void __thiscall asl::Var::Var(Var *this,uint y)

{
  uint y_local;
  Var *this_local;
  
  if (y < 0x80000000) {
    this->_type = INT;
    (this->field_1)._i = y;
  }
  else {
    this->_type = NUMBER;
    (this->field_1)._d = (double)y;
  }
  return;
}

Assistant:

Var::Var(unsigned y)
{
	if (y < 2147483648u) {
		_type = INT;
		_i = (int)y;
	}
	else {
		_type = NUMBER;
		_d = (double)y;
	}
}